

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testEncoding.cxx
# Opt level: O2

int testEncoding(int param_1,char **param_2)

{
  _Alloc_hider _Var1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  wchar_t *pwVar6;
  char **ppcVar7;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *cstr_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  wchar_t *extraout_RDX_03;
  wchar_t *extraout_RDX_04;
  wchar_t *extraout_RDX_05;
  wchar_t *extraout_RDX_06;
  uint uVar8;
  uint uVar9;
  size_t i;
  ulong uVar10;
  int i_2;
  long lVar11;
  uint local_b4;
  string str;
  wstring wstr;
  char cstr [2];
  undefined6 uStack_66;
  string local_50;
  
  pcVar4 = setlocale(6,"");
  if (pcVar4 == (char *)0x0) {
    poVar5 = (ostream *)&std::cout;
    pcVar4 = "Locale: None";
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"Locale: ");
  }
  poVar5 = std::operator<<(poVar5,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar5);
  lVar11 = 0;
  local_b4 = 0;
  pcVar4 = extraout_RDX;
  do {
    if (lVar11 == 0x100) {
      _cstr = (char *)CONCAT62(uStack_66,0xff);
      cmsys::Encoding::ToWide_abi_cxx11_((wstring *)&str,(Encoding *)cstr,pcVar4);
      cmsys::Encoding::ToWide_abi_cxx11_(&wstr,(Encoding *)0x0,cstr_00);
      std::__cxx11::wstring::operator=((wstring *)&str,(wstring *)&wstr);
      std::__cxx11::wstring::~wstring((wstring *)&wstr);
      bVar2 = std::operator!=((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)&str,L"");
      _Var1 = str._M_dataplus;
      uVar9 = 0;
      pcVar4 = extraout_RDX_01;
      if (bVar2) {
        std::operator<<((ostream *)&std::cout,"ToWide(NULL) returned");
        for (uVar10 = 0; uVar10 < str._M_string_length; uVar10 = uVar10 + 1) {
          poVar5 = std::operator<<((ostream *)&std::cout," ");
          *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
               *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
          std::ostream::operator<<(poVar5,*(int *)(_Var1._M_p + uVar10 * 4));
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        uVar9 = 1;
        pcVar4 = extraout_RDX_02;
      }
      cmsys::Encoding::ToWide_abi_cxx11_(&wstr,(Encoding *)"",pcVar4);
      std::__cxx11::wstring::operator=((wstring *)&str,(wstring *)&wstr);
      std::__cxx11::wstring::~wstring((wstring *)&wstr);
      bVar2 = std::operator!=((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)&str,L"");
      pwVar6 = extraout_RDX_03;
      if (bVar2) {
        std::operator<<((ostream *)&std::cout,"ToWide(\"\") returned");
        for (uVar10 = 0; uVar10 < str._M_string_length; uVar10 = uVar10 + 1) {
          poVar5 = std::operator<<((ostream *)&std::cout," ");
          *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
               *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
          std::ostream::operator<<(poVar5,*(int *)(str._M_dataplus._M_p + uVar10 * 4));
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        uVar9 = uVar9 + 1;
        pwVar6 = extraout_RDX_04;
      }
      cmsys::Encoding::ToNarrow_abi_cxx11_((string *)&wstr,(Encoding *)0x0,pwVar6);
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &wstr,"");
      pwVar6 = extraout_RDX_05;
      if (bVar2) {
        poVar5 = std::operator<<((ostream *)&std::cout,"ToNarrow(NULL) returned ");
        poVar5 = std::operator<<(poVar5,(string *)&wstr);
        std::endl<char,std::char_traits<char>>(poVar5);
        uVar9 = uVar9 + 1;
        pwVar6 = extraout_RDX_06;
      }
      cmsys::Encoding::ToNarrow_abi_cxx11_(&local_50,(Encoding *)L"",pwVar6);
      std::__cxx11::string::operator=((string *)&wstr,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      bVar2 = std::operator!=((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)&str,L"");
      if (bVar2) {
        poVar5 = std::operator<<((ostream *)&std::cout,"ToNarrow(\"\") returned ");
        poVar5 = std::operator<<(poVar5,(string *)&wstr);
        std::endl<char,std::char_traits<char>>(poVar5);
        uVar9 = uVar9 + 1;
      }
      std::__cxx11::string::~string((string *)&wstr);
      std::__cxx11::wstring::~wstring((wstring *)&str);
      _cstr = "./app.exe";
      cmsys::Encoding::CommandLineArguments::CommandLineArguments
                ((CommandLineArguments *)&str,2,(char **)cstr);
      cmsys::Encoding::CommandLineArguments::CommandLineArguments
                ((CommandLineArguments *)&wstr,(CommandLineArguments *)&str);
      ppcVar7 = cmsys::Encoding::CommandLineArguments::argv((CommandLineArguments *)&str);
      lVar11 = 0;
      uVar8 = 0;
      while( true ) {
        iVar3 = cmsys::Encoding::CommandLineArguments::argc((CommandLineArguments *)&str);
        if (iVar3 <= lVar11) break;
        pcVar4 = ppcVar7[lVar11];
        iVar3 = strcmp(*(char **)(cstr + lVar11 * 8),pcVar4);
        if (iVar3 != 0) {
          poVar5 = std::operator<<((ostream *)&std::cout,"argv[");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar11);
          poVar5 = std::operator<<(poVar5,"] ");
          poVar5 = std::operator<<(poVar5,*(char **)(cstr + lVar11 * 8));
          poVar5 = std::operator<<(poVar5," != ");
          poVar5 = std::operator<<(poVar5,pcVar4);
          std::endl<char,std::char_traits<char>>(poVar5);
          uVar8 = uVar8 + 1;
        }
        lVar11 = lVar11 + 1;
      }
      cmsys::Encoding::CommandLineArguments::Main((CommandLineArguments *)&local_50,2,(char **)cstr)
      ;
      cmsys::Encoding::CommandLineArguments::~CommandLineArguments
                ((CommandLineArguments *)&local_50);
      cmsys::Encoding::CommandLineArguments::~CommandLineArguments((CommandLineArguments *)&wstr);
      cmsys::Encoding::CommandLineArguments::~CommandLineArguments((CommandLineArguments *)&str);
      return uVar9 | local_b4 | uVar8;
    }
    std::__cxx11::string::string
              ((string *)&str,(char *)(helloWorldStrings[0] + lVar11),(allocator *)&wstr);
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)&str);
    std::endl<char,std::char_traits<char>>(poVar5);
    cmsys::Encoding::ToWide(&wstr,&str);
    cmsys::Encoding::ToNarrow(&local_50,&wstr);
    pwVar6 = cmsysEncoding_DupToWide(str._M_dataplus._M_p);
    pcVar4 = cmsysEncoding_DupToNarrow(pwVar6);
    if (wstr._M_string_length != 0) {
      bVar2 = std::operator!=(&str,&local_50);
      if (!bVar2) {
        iVar3 = strcmp(pcVar4,str._M_dataplus._M_p);
        if (iVar3 == 0) goto LAB_00123268;
      }
      poVar5 = std::operator<<((ostream *)&std::cout,"converted string was different: ");
      poVar5 = std::operator<<(poVar5,(string *)&local_50);
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"converted string was different: ");
      poVar5 = std::operator<<(poVar5,pcVar4);
      std::endl<char,std::char_traits<char>>(poVar5);
      local_b4 = local_b4 + 1;
    }
LAB_00123268:
    free(pwVar6);
    free(pcVar4);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::wstring::~wstring((wstring *)&wstr);
    std::__cxx11::string::~string((string *)&str);
    lVar11 = lVar11 + 0x20;
    pcVar4 = extraout_RDX_00;
  } while( true );
}

Assistant:

int testEncoding(int, char*[])
{
  const char* loc = setlocale(LC_ALL, "");
  if(loc)
    {
    std::cout << "Locale: " << loc << std::endl;
    }
  else
    {
    std::cout << "Locale: None" << std::endl;
    }

  int ret = 0;

  ret |= testHelloWorldEncoding();
  ret |= testRobustEncoding();
  ret |= testCommandLineArguments();

  return ret;
}